

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_compute_blob.h
# Opt level: O0

void ncnn::gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  float fVar5;
  float fVar6;
  int *iptr_1;
  bool in_bound_1;
  int y0_1;
  int x0_1;
  float sample_y_1;
  float sample_x_1;
  int x_1;
  float *gridptr_y;
  float *gridptr_x;
  int *iptr;
  bool in_bound;
  int y0;
  int x0;
  float sample_y;
  float sample_x;
  int x;
  float *gridptr;
  int y;
  compute_coord<(ncnn::GridSample::PaddingMode)3,_false> get_coord;
  grid_sample_unormalize<false> unormalize;
  float *offset_ptr;
  int grid_size;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  double local_4f8;
  undefined8 in_stack_fffffffffffffb18;
  undefined8 *puVar7;
  compute_coord<(ncnn::GridSample::PaddingMode)3,_false> *in_stack_fffffffffffffb20;
  double local_4a0;
  int local_42c;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 local_418;
  undefined4 local_410;
  long local_408;
  undefined4 local_400;
  undefined4 local_3fc;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined8 local_3e8;
  float *local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined4 local_3c0;
  long local_3b8;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined8 local_398;
  float *local_390;
  int *local_388;
  undefined1 local_37d;
  uint local_37c;
  uint local_378;
  float local_374;
  float local_370;
  int local_36c;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined4 local_350;
  long local_348;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined8 local_328;
  float *local_320;
  int local_318;
  grid_sample_unormalize<false> local_311;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined4 local_2f8;
  long local_2f0;
  undefined4 local_2e8;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined8 local_2d0;
  int *local_2c8;
  int local_2c0;
  long *local_2b0;
  long local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_278;
  undefined8 *local_268;
  undefined8 *local_258;
  undefined8 *local_248;
  undefined1 local_21d;
  undefined4 local_21c;
  undefined8 *local_210;
  undefined1 local_1e5;
  undefined4 local_1e4;
  undefined8 *local_1d8;
  undefined1 local_1ad;
  int local_1ac;
  undefined8 *local_1a0;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined1 local_15d;
  undefined4 local_15c;
  undefined8 *local_150;
  undefined8 *local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  int *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  float *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  long local_b0;
  undefined4 local_a4;
  long local_a0;
  float *local_98;
  undefined4 local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  float *local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_2c0 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6];
  local_150 = &local_310;
  local_f4 = *(int *)((long)in_RDX + 0x2c);
  local_f8 = (int)in_RDX[6];
  local_fc = *(undefined4 *)((long)in_RDX + 0x34);
  local_2c8 = (int *)*in_RDX;
  local_110 = in_RDX[2];
  local_114 = (undefined4)in_RDX[3];
  local_120 = in_RDX[4];
  local_f0 = &local_310;
  local_8 = (long)local_f4 * (long)local_f8 * local_110;
  local_128 = &local_310;
  local_2a0 = &local_310;
  local_c = 0x10;
  local_15c = 0;
  local_15d = 1;
  local_310 = 0;
  local_300 = 0;
  local_2f8 = 0;
  local_2e8 = 0;
  local_2e4 = 0;
  local_2e0 = 0;
  local_2dc = 0;
  local_2d8 = 0;
  local_2d0 = 0;
  local_308 = 0;
  local_2a8 = in_RDI;
  local_248 = local_2a0;
  local_108 = local_2c8;
  local_2f0 = local_120;
  if (in_ECX == 0) {
    local_2b0 = in_RSI;
    for (local_318 = 0; local_318 < (int)local_2b0[7]; local_318 = local_318 + 1) {
      local_1a0 = &local_368;
      local_bc = *(int *)((long)local_2b0 + 0x2c);
      local_c0 = (int)local_2b0[6];
      local_c4 = *(undefined4 *)((long)local_2b0 + 0x34);
      local_320 = (float *)(*local_2b0 + local_2b0[8] * (long)local_318 * local_2b0[2]);
      local_d8 = local_2b0[2];
      local_dc = (undefined4)local_2b0[3];
      local_e8 = local_2b0[4];
      local_b8 = &local_368;
      local_18 = (long)local_bc * (long)local_c0 * local_d8;
      local_168 = &local_368;
      local_298 = &local_368;
      local_1c = 0x10;
      local_1ac = local_318;
      local_1ad = 1;
      local_368 = 0;
      local_358 = 0;
      local_350 = 0;
      local_340 = 0;
      local_33c = 0;
      local_338 = 0;
      local_334 = 0;
      local_330 = 0;
      local_328 = 0;
      local_360 = 0;
      local_258 = local_298;
      local_d0 = local_320;
      local_348 = local_e8;
      for (local_36c = 0; local_36c < local_2c0; local_36c = local_36c + 2) {
        local_370 = *local_320;
        local_374 = local_320[1];
        local_370 = grid_sample_unormalize<false>::operator()
                              (&local_311,*(int *)(local_2a8 + 0x2c),local_370);
        local_370 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                              (in_stack_fffffffffffffb20,
                               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
                               (float)in_stack_fffffffffffffb18);
        local_374 = grid_sample_unormalize<false>::operator()
                              (&local_311,*(int *)(local_2a8 + 0x30),local_374);
        local_374 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                              (in_stack_fffffffffffffb20,
                               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
                               (float)in_stack_fffffffffffffb18);
        fVar5 = floorf(local_370 + 0.5);
        local_378 = (uint)fVar5;
        fVar5 = floorf(local_374 + 0.5);
        local_37c = (uint)fVar5;
        bVar1 = (int)local_378 < *(int *)(local_2a8 + 0x2c);
        bVar2 = (int)local_37c < *(int *)(local_2a8 + 0x30);
        local_37d = ((local_378 < 0x80000000 && bVar1) && local_37c < 0x80000000) && bVar2;
        local_388 = local_2c8;
        if (((local_378 < 0x80000000 && bVar1) && local_37c < 0x80000000) && bVar2) {
          local_4a0 = (double)(int)((local_378 + local_37c * *(int *)(local_2a8 + 0x2c)) *
                                   *(int *)(local_2a8 + 0x18));
        }
        else {
          local_4a0 = -1.0;
        }
        *local_2c8 = (int)local_4a0;
        local_320 = local_320 + 2;
        local_2c8 = local_2c8 + 1;
      }
    }
  }
  else {
    local_1d8 = &local_3d8;
    local_84 = *(int *)((long)in_RSI + 0x2c);
    local_88 = (int)in_RSI[6];
    local_8c = *(undefined4 *)((long)in_RSI + 0x34);
    local_390 = (float *)*in_RSI;
    local_a0 = in_RSI[2];
    local_a4 = (undefined4)in_RSI[3];
    local_b0 = in_RSI[4];
    local_80 = &local_3d8;
    local_28 = (long)local_84 * (long)local_88 * local_a0;
    local_170 = &local_3d8;
    local_290 = &local_3d8;
    local_210 = &local_428;
    local_4c = *(int *)((long)in_RSI + 0x2c);
    local_50 = (int)in_RSI[6];
    local_54 = *(undefined4 *)((long)in_RSI + 0x34);
    local_3e0 = (float *)(*in_RSI + in_RSI[8] * in_RSI[2]);
    local_68 = in_RSI[2];
    local_6c = (undefined4)in_RSI[3];
    local_78 = in_RSI[4];
    local_48 = &local_428;
    local_38 = (long)local_4c * (long)local_50 * local_68;
    local_178 = &local_428;
    puVar7 = &local_428;
    local_2d8 = 0;
    local_2dc = 0;
    local_2e0 = 0;
    local_2e4 = 0;
    local_2f8 = 0;
    local_300 = 0;
    local_308 = 0;
    local_310 = 0;
    local_3a0 = 0;
    local_3a4 = 0;
    local_3a8 = 0;
    local_3ac = 0;
    local_3c0 = 0;
    local_3c8 = 0;
    local_3d0 = 0;
    local_3d8 = 0;
    local_c = 0x10;
    local_2c = 0x10;
    local_3c = 0x10;
    local_15c = 0;
    local_15d = 1;
    local_1e4 = 0;
    local_1e5 = 1;
    local_21c = 1;
    local_21d = 1;
    local_2d0 = 0;
    local_2e8 = 0;
    local_398 = 0;
    local_3b0 = 0;
    local_428 = 0;
    local_418 = 0;
    local_410 = 0;
    local_400 = 0;
    local_3fc = 0;
    local_3f8 = 0;
    local_3f4 = 0;
    local_3f0 = 0;
    local_3e8 = 0;
    local_420 = 0;
    local_288 = puVar7;
    local_278 = puVar7;
    local_268 = local_290;
    local_98 = local_390;
    local_60 = local_3e0;
    local_408 = local_78;
    local_3b8 = local_b0;
    for (local_42c = 0; local_42c < local_2c0; local_42c = local_42c + 1) {
      fVar5 = *local_3e0;
      grid_sample_unormalize<false>::operator()(&local_311,*(int *)(local_2a8 + 0x2c),*local_390);
      fVar6 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                        (in_stack_fffffffffffffb20,(int)((ulong)puVar7 >> 0x20),SUB84(puVar7,0));
      grid_sample_unormalize<false>::operator()(&local_311,*(int *)(local_2a8 + 0x30),fVar5);
      fVar5 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                        (in_stack_fffffffffffffb20,(int)((ulong)puVar7 >> 0x20),SUB84(puVar7,0));
      fVar6 = floorf(fVar6 + 0.5);
      uVar3 = (uint)fVar6;
      fVar5 = floorf(fVar5 + 0.5);
      uVar4 = (uint)fVar5;
      if (((uVar3 < 0x80000000 && (int)uVar3 < *(int *)(local_2a8 + 0x2c)) && uVar4 < 0x80000000) &&
          (int)uVar4 < *(int *)(local_2a8 + 0x30)) {
        local_4f8 = (double)(int)((uVar3 + uVar4 * *(int *)(local_2a8 + 0x2c)) *
                                 *(int *)(local_2a8 + 0x18));
      }
      else {
        local_4f8 = -1.0;
      }
      *local_2c8 = (int)local_4f8;
      local_390 = local_390 + 1;
      local_3e0 = local_3e0 + 1;
      local_2c8 = local_2c8 + 1;
    }
  }
  return;
}

Assistant:

void gridsample_2d_nearest_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
                gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

                __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                                  _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

                __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

                offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

                _mm256_storeu_ps(offset_ptr, offset);

                gridptr += 16;
                offset_ptr += 8;
            }

#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                int x0 = static_cast<int>(floorf(sample_x + 0.5f));
                int y0 = static_cast<int>(floorf(sample_y + 0.5f));

                bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

                int* iptr = (int*)offset_ptr;
                *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

                gridptr += 2;
                offset_ptr++;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
            gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

            __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                              _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

            __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

            offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

            _mm256_storeu_ps(offset_ptr, offset);

            gridptr_x += 8;
            gridptr_y += 8;
            offset_ptr += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            int x0 = static_cast<int>(floorf(sample_x + 0.5f));
            int y0 = static_cast<int>(floorf(sample_y + 0.5f));

            bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

            int* iptr = (int*)offset_ptr;
            *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

            gridptr_x++;
            gridptr_y++;

            offset_ptr++;
        }
    }
}